

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# euc_jp.c
# Opt level: O0

int is_valid_mbc_string(OnigUChar *p,OnigUChar *end)

{
  byte *pbVar1;
  OnigUChar *end_local;
  OnigUChar *p_local;
  
  end_local = p;
  while( true ) {
    while( true ) {
      while( true ) {
        if (end <= end_local) {
          return 1;
        }
        if (0x7f < *end_local) break;
        end_local = end_local + 1;
      }
      if ((*end_local == 0x80) || (*end_local == 0xff)) {
        return 0;
      }
      pbVar1 = end_local + 1;
      if (end <= pbVar1) {
        return 0;
      }
      if (*pbVar1 < 0x40) break;
      if ((*pbVar1 == 0x7f) || (*pbVar1 == 0xff)) {
        return 0;
      }
      end_local = end_local + 2;
    }
    if ((*pbVar1 < 0x30) || (0x39 < *pbVar1)) {
      return 0;
    }
    pbVar1 = end_local + 2;
    if (end <= pbVar1) {
      return 0;
    }
    if ((*pbVar1 < 0x81) || (*pbVar1 == 0xff)) break;
    pbVar1 = end_local + 3;
    if (end <= pbVar1) {
      return 0;
    }
    if ((*pbVar1 < 0x30) || (0x39 < *pbVar1)) {
      return 0;
    }
    end_local = end_local + 4;
  }
  return 0;
}

Assistant:

static int
is_valid_mbc_string(const UChar* p, const UChar* end)
{
  while (p < end) {
    if (*p < 0x80) {
      p++;
    }
    else if (*p > 0xa0) {
      if (*p == 0xff) return FALSE;
      p++;
      if (p >= end) return FALSE;
      if (*p < 0xa1 || *p == 0xff) return FALSE;
      p++;
    }
    else if (*p == 0x8e) {
      p++;
      if (p >= end) return FALSE;
      if (*p < 0xa1 || *p > 0xdf) return FALSE;
      p++;
    }
    else if (*p == 0x8f) {
      p++;
      if (p >= end) return FALSE;
      if (*p < 0xa1 || *p == 0xff) return FALSE;
      p++;
      if (p >= end) return FALSE;
      if (*p < 0xa1 || *p == 0xff) return FALSE;
      p++;
    }
    else
      return FALSE;
  }

  return TRUE;
}